

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

float * FAudio_INTERNAL_ProcessEffectChain(FAudioVoice *voice,float *buffer,uint32_t *samples)

{
  long lVar1;
  float *pfVar2;
  FAudioEffectDescriptor *pFVar3;
  uint uVar4;
  ulong uVar5;
  FAudio *pFVar6;
  long lVar7;
  float *local_60;
  FAPOBufferFlags local_58;
  uint local_54;
  FAPOProcessBufferParameters srcParams;
  
  srcParams.BufferFlags = FAPO_BUFFER_SILENT;
  local_54 = *samples;
  uVar5 = 0;
  do {
    if (local_54 == uVar5) goto LAB_00118111;
    pfVar2 = buffer + uVar5;
    uVar5 = uVar5 + 1;
  } while ((*pfVar2 == 0.0) && (!NAN(*pfVar2)));
  srcParams.BufferFlags = FAPO_BUFFER_VALID;
LAB_00118111:
  local_58 = FAPO_BUFFER_VALID;
  lVar7 = 0;
  local_60 = buffer;
  srcParams.pBuffer = buffer;
  srcParams.ValidFrameCount = local_54;
  for (uVar5 = 0; uVar5 < (voice->effects).count; uVar5 = uVar5 + 1) {
    pFVar3 = (voice->effects).desc;
    lVar1 = *(long *)((long)&pFVar3->pEffect + lVar7);
    if ((voice->effects).inPlaceProcessing[uVar5] == '\0') {
      pfVar2 = buffer;
      if (local_60 == buffer) {
        pFVar6 = voice->audio;
        uVar4 = *(int *)((long)&pFVar3->OutputChannels + lVar7) * srcParams.ValidFrameCount;
        if (pFVar6->effectChainSamples < uVar4) {
          pFVar6->effectChainSamples = uVar4;
          pfVar2 = (float *)(*pFVar6->pRealloc)(pFVar6->effectChainCache,(ulong)uVar4 << 2);
          pFVar6->effectChainCache = pfVar2;
          pFVar6 = voice->audio;
          pFVar3 = (voice->effects).desc;
        }
        pfVar2 = pFVar6->effectChainCache;
      }
      local_60 = pfVar2;
      SDL_memset(pfVar2,0,(ulong)(srcParams.ValidFrameCount *
                                 *(int *)((long)&pFVar3->OutputChannels + lVar7)) << 2);
    }
    if ((voice->effects).parameterUpdates[uVar5] != '\0') {
      (**(code **)(lVar1 + 0x60))
                (lVar1,(voice->effects).parameters[uVar5],(voice->effects).parameterSizes[uVar5]);
      (voice->effects).parameterUpdates[uVar5] = '\0';
    }
    (**(code **)(lVar1 + 0x48))
              (lVar1,1,&srcParams,1,&local_60,
               *(undefined4 *)((long)&((voice->effects).desc)->InitialState + lVar7));
    SDL_memcpy(&srcParams,&local_60,0x10);
    lVar7 = lVar7 + 0x10;
  }
  *samples = local_54;
  (voice->effects).state = local_58;
  return local_60;
}

Assistant:

static inline float *FAudio_INTERNAL_ProcessEffectChain(
	FAudioVoice *voice,
	float *buffer,
	uint32_t *samples
) {
	uint32_t i;
	FAPO *fapo;
	FAPOProcessBufferParameters srcParams, dstParams;

	LOG_FUNC_ENTER(voice->audio)

	/* Set up the buffer to be written into */
	srcParams.pBuffer = buffer;
	srcParams.BufferFlags = FAPO_BUFFER_SILENT;
	srcParams.ValidFrameCount = *samples;
	for (i = 0; i < srcParams.ValidFrameCount; i += 1)
	{
		if (buffer[i] != 0.0f) /* Arbitrary! */
		{
			srcParams.BufferFlags = FAPO_BUFFER_VALID;
			break;
		}
	}

	/* Initialize output parameters to something sane */
	dstParams.pBuffer = srcParams.pBuffer;
	dstParams.BufferFlags = FAPO_BUFFER_VALID;
	dstParams.ValidFrameCount = srcParams.ValidFrameCount;

	/* Update parameters, process! */
	for (i = 0; i < voice->effects.count; i += 1)
	{
		fapo = voice->effects.desc[i].pEffect;

		if (!voice->effects.inPlaceProcessing[i])
		{
			if (dstParams.pBuffer == buffer)
			{
				FAudio_INTERNAL_ResizeEffectChainCache(
					voice->audio,
					voice->effects.desc[i].OutputChannels * srcParams.ValidFrameCount
				);
				dstParams.pBuffer = voice->audio->effectChainCache;
			}
			else
			{
				/* FIXME: What if this is smaller because
				 * inputChannels < desc[i].OutputChannels?
				 */
				dstParams.pBuffer = buffer;
			}

			FAudio_zero(
				dstParams.pBuffer,
				voice->effects.desc[i].OutputChannels * srcParams.ValidFrameCount * sizeof(float)
			);
		}

		if (voice->effects.parameterUpdates[i])
		{
			fapo->SetParameters(
				fapo,
				voice->effects.parameters[i],
				voice->effects.parameterSizes[i]
			);
			voice->effects.parameterUpdates[i] = 0;
		}

		fapo->Process(
			fapo,
			1,
			&srcParams,
			1,
			&dstParams,
			voice->effects.desc[i].InitialState
		);

		FAudio_memcpy(&srcParams, &dstParams, sizeof(dstParams));
	}

	*samples = dstParams.ValidFrameCount;

	/* Save the output buffer-flags so the mixer-function can determine when it's save to stop processing the effect chain */
	voice->effects.state = dstParams.BufferFlags;

	LOG_FUNC_EXIT(voice->audio)
	return (float*) dstParams.pBuffer;
}